

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O0

void tchecker::declare_flattened_variable<unsigned_int,tchecker::clock_info_t>
               (uint id,string *name,clock_info_t *info,
               function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
               *declare)

{
  uint __args;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [380];
  uint local_34;
  size_info_t local_30;
  size_t_conflict i;
  clock_info_t flat_info;
  size_t_conflict size;
  function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
  *declare_local;
  clock_info_t *info_local;
  string *name_local;
  uint id_local;
  
  _flat_info = declare;
  i = size_info_t::size(&info->super_size_info_t);
  if (i == 1) {
    std::
    function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
    ::operator()(declare,id,name,info);
  }
  else {
    local_30._size = (info->super_size_info_t)._size;
    size_info_t::flatten(&local_30);
    for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar1 = std::operator<<(local_1b0,(string *)name);
      poVar1 = std::operator<<(poVar1,"[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
      std::operator<<(poVar1,"]");
      __args = id + local_34;
      std::__cxx11::stringstream::str();
      std::
      function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
      ::operator()(declare,__args,&local_1f0,(clock_info_t *)&local_30);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::stringstream::~stringstream(local_1c0);
    }
  }
  return;
}

Assistant:

void declare_flattened_variable(ID id, std::string const & name, INFO const & info,
                                std::function<void(ID, std::string const &, INFO const &)> declare)
{
  static_assert(std::is_base_of<tchecker::size_info_t, INFO>::value, "INFO should provide variable size");

  typename INFO::size_t size = info.size();

  if (size == 1)
    declare(id, name, info);
  else {
    INFO flat_info{info};
    flat_info.flatten();

    for (typename INFO::size_t i = 0; i < size; ++i) {
      std::stringstream ss;
      ss << name << "[" << i << "]";
      declare(id + i, ss.str(), flat_info);
    }
  }
}